

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAddiRg<(moira::Instr)120,(moira::Mode)0,(moira::Size)4>(Moira *this,u16 opcode)

{
  ushort uVar1;
  uint uVar2;
  u32 uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar5 = (int)this->queue << 0x10;
  readExt(this);
  uVar1 = (this->queue).irc;
  readExt(this);
  uVar2 = *(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58);
  uVar7 = (ulong)uVar2 - (ulong)(uVar1 | uVar5);
  bVar4 = (bool)((byte)(uVar7 >> 0x20) & 1);
  (this->reg).sr.c = bVar4;
  (this->reg).sr.x = bVar4;
  uVar6 = (uint)uVar7;
  (this->reg).sr.v = (int)((uVar6 ^ uVar2) & (uVar5 ^ uVar2)) < 0;
  (this->reg).sr.z = uVar6 == 0;
  (this->reg).sr.n = (bool)((byte)(uVar7 >> 0x1f) & 1);
  uVar3 = (this->reg).pc;
  (this->reg).pc0 = uVar3;
  (this->queue).ird = (this->queue).irc;
  uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar3 + 2);
  (this->queue).irc = (u16)uVar3;
  (*this->_vptr_Moira[0x19])(this,4);
  *(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) = uVar6;
  return;
}

Assistant:

void
Moira::execAddiRg(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 ea, data, result;
    if (!readOp<M,S>(dst, ea, data)) return;

    result = addsub<I,S>(src, data);
    prefetch<POLLIPL>();

    if (S == Long) sync(4);
    writeD<S>(dst, result);
}